

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_cast_expression.cpp
# Opt level: O3

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::BoundCastExpression::Copy(BoundCastExpression *this)

{
  pointer pEVar1;
  pointer this_00;
  pointer *__ptr;
  Expression *in_RSI;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_38;
  unique_ptr<duckdb::BoundCastExpression,_std::default_delete<duckdb::BoundCastExpression>_>
  local_30;
  BoundCastInfo local_28;
  
  pEVar1 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)(in_RSI + 1));
  (*(pEVar1->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_38,pEVar1);
  BoundCastInfo::Copy(&local_28,(BoundCastInfo *)&in_RSI[1].super_BaseExpression.alias);
  make_uniq<duckdb::BoundCastExpression,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,duckdb::LogicalType_const&,duckdb::BoundCastInfo,bool_const&>
            ((duckdb *)&local_30,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_38,&in_RSI->return_type,&local_28,(bool *)&in_RSI[1].super_BaseExpression.type);
  if ((_Head_base<0UL,_duckdb::BoundCastData_*,_false>)
      local_28.cast_data.
      super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t.
      super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t
      .super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>.
      super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl !=
      (_Head_base<0UL,_duckdb::BoundCastData_*,_false>)0x0) {
    (*(*(_func_int ***)
        local_28.cast_data.
        super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t.
        super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>.
        _M_t.
        super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>
        .super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl)[1])();
  }
  if (local_38._M_head_impl != (Expression *)0x0) {
    (*((local_38._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  this_00 = unique_ptr<duckdb::BoundCastExpression,_std::default_delete<duckdb::BoundCastExpression>,_true>
            ::operator->((unique_ptr<duckdb::BoundCastExpression,_std::default_delete<duckdb::BoundCastExpression>,_true>
                          *)&local_30);
  Expression::CopyProperties(&this_00->super_Expression,in_RSI);
  (this->super_Expression).super_BaseExpression._vptr_BaseExpression =
       (_func_int **)
       local_30._M_t.
       super___uniq_ptr_impl<duckdb::BoundCastExpression,_std::default_delete<duckdb::BoundCastExpression>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::BoundCastExpression_*,_std::default_delete<duckdb::BoundCastExpression>_>
       .super__Head_base<0UL,_duckdb::BoundCastExpression_*,_false>._M_head_impl;
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> BoundCastExpression::Copy() const {
	auto copy = make_uniq<BoundCastExpression>(child->Copy(), return_type, bound_cast.Copy(), try_cast);
	copy->CopyProperties(*this);
	return std::move(copy);
}